

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O2

void __thiscall CVmObjDict::create_hash_table(CVmObjDict *this)

{
  vm_obj_id_t obj;
  uint uVar1;
  undefined4 uVar2;
  CVmObjPageEntry *pCVar3;
  CVmHashTable *this_00;
  vmdict_TrieNode *this_01;
  int iVar4;
  CVmHashFunc *hash_function;
  CVmHashTable *this_02;
  char *pcVar5;
  
  obj = *(vm_obj_id_t *)((this->super_CVmObject).ext_ + 0x20);
  if (obj == 0) {
    hash_function = (CVmHashFunc *)operator_new(8);
    hash_function->_vptr_CVmHashFunc = (_func_int **)&PTR__CVmHashFunc_0035e8a8;
  }
  else {
    iVar4 = CVmObjStrComp::is_strcmp_obj(obj);
    if (iVar4 == 0) {
      hash_function = (CVmHashFunc *)operator_new(0x18);
      uVar2 = *(undefined4 *)((this->super_CVmObject).ext_ + 0x20);
      hash_function->_vptr_CVmHashFunc = (_func_int **)&PTR__CVmHashFunc_0035bbf8;
      hash_function[2]._vptr_CVmHashFunc = (_func_int **)0x0;
      *(undefined4 *)&hash_function[1]._vptr_CVmHashFunc = uVar2;
    }
    else {
      hash_function = (CVmHashFunc *)operator_new(0x10);
      uVar1 = *(uint *)((this->super_CVmObject).ext_ + 0x20);
      pCVar3 = G_obj_table_X.pages_[uVar1 >> 0xc];
      hash_function->_vptr_CVmHashFunc = (_func_int **)&PTR__CVmHashFunc_0035bba8;
      hash_function[1]._vptr_CVmHashFunc = (_func_int **)(pCVar3 + (uVar1 & 0xfff));
    }
  }
  this_02 = (CVmHashTable *)operator_new(0x20);
  CVmHashTable::CVmHashTable(this_02,0x100,hash_function,1);
  pcVar5 = (this->super_CVmObject).ext_;
  if (*(CVmHashTable **)(pcVar5 + 0x10) != (CVmHashTable *)0x0) {
    CVmHashTable::move_entries_to(*(CVmHashTable **)(pcVar5 + 0x10),this_02);
    this_00 = *(CVmHashTable **)((this->super_CVmObject).ext_ + 0x10);
    if (this_00 != (CVmHashTable *)0x0) {
      CVmHashTable::~CVmHashTable(this_00);
    }
    operator_delete(this_00,0x20);
    pcVar5 = (this->super_CVmObject).ext_;
  }
  this_01 = *(vmdict_TrieNode **)(pcVar5 + 0x38);
  if (this_01 != (vmdict_TrieNode *)0x0) {
    vmdict_TrieNode::~vmdict_TrieNode(this_01);
    operator_delete(this_01,0x18);
    pcVar5 = (this->super_CVmObject).ext_;
    pcVar5[0x38] = '\0';
    pcVar5[0x39] = '\0';
    pcVar5[0x3a] = '\0';
    pcVar5[0x3b] = '\0';
    pcVar5[0x3c] = '\0';
    pcVar5[0x3d] = '\0';
    pcVar5[0x3e] = '\0';
    pcVar5[0x3f] = '\0';
    pcVar5 = (this->super_CVmObject).ext_;
  }
  *(CVmHashTable **)(pcVar5 + 0x10) = this_02;
  return;
}

Assistant:

void CVmObjDict::create_hash_table(VMG0_)
{
    CVmHashTable *new_tab;
    CVmHashFunc *hash_func;
    
    /*
     *   Create our hash function.  If we have a comparator object, base the
     *   hash function on the comparator; use a special hash function if we
     *   specifically have a StringComparator, since we can call these
     *   directly for better efficiency.  If we have no comparator, create a
     *   generic exact string match hash function.  
     */
    if (get_ext()->comparator_ != VM_INVALID_OBJ)
    {
        /* 
         *   use our special StringComparator hash function if possible;
         *   otherwise, use a generic comparator hash function 
         */
        if (CVmObjStrComp::is_strcmp_obj(vmg_ get_ext()->comparator_))
        {
            /* create a StringComparator hash function */
            hash_func = new CVmHashFuncStrComp(
                (CVmObjStrComp *)vm_objp(vmg_ get_ext()->comparator_));
        }
        else
        {
            /* create a generic comparator hash function */
            hash_func = new CVmHashFuncComparator(
                vmg_ get_ext()->comparator_);
        }
    }